

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbsptree.cpp
# Opt level: O1

void __thiscall QBspTree::create(QBspTree *this,int n,int d)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  if (d == -1) {
    d = 0;
    iVar2 = 0;
    if (n != 0) {
      do {
        uVar1 = n + 9;
        d = iVar2 + 2;
        n = n / 10;
        iVar2 = d;
      } while (0x12 < uVar1);
    }
  }
  uVar3 = d + (uint)(d == 0);
  this->depth = uVar3;
  QList<QBspTree::Node>::resize(&this->nodes,~(-1L << ((byte)uVar3 & 0x3f)));
  QList<QList<int>_>::resize(&this->leaves,1L << ((byte)this->depth & 0x3f));
  return;
}

Assistant:

void QBspTree::create(int n, int d)
{
    // simple heuristics to find the best tree depth
    if (d == -1) {
        int c;
        for (c = 0; n; ++c)
            n = n / 10;
        depth = c << 1;
    } else {
        depth = d;
    }
    depth = qMax(depth, uint(1));

    nodes.resize((1ll << depth) - 1); // resize to number of nodes
    leaves.resize(1ll << depth); // resize to number of leaves
}